

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O1

int dic_find(dictionary *dic,void *key,int keyn)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  keynode *pkVar6;
  uint uVar7;
  
  uVar4 = 0x811c9dc5;
  puVar3 = (uint *)key;
  uVar7 = keyn;
  uVar5 = keyn;
  if (7 < keyn) {
    do {
      uVar4 = (uVar4 ^ puVar3[1] ^ (*puVar3 << 5 | *puVar3 >> 0x1b)) * 0xad3e7;
      uVar5 = uVar7 - 8;
      puVar3 = puVar3 + 2;
      bVar1 = 0xf < (int)uVar7;
      uVar7 = uVar5;
    } while (bVar1);
  }
  if ((uVar5 & 4) != 0) {
    uVar4 = ((uint)*(ushort *)((long)puVar3 + 2) ^ (uVar4 ^ (ushort)*puVar3) * 0xad3e7) * 0xad3e7;
    puVar3 = puVar3 + 1;
  }
  if ((uVar5 & 2) != 0) {
    uVar4 = (uVar4 ^ (ushort)*puVar3) * 0xad3e7;
    puVar3 = (uint *)((long)puVar3 + 2);
  }
  if ((uVar5 & 1) != 0) {
    uVar4 = (uVar4 ^ (int)(char)*puVar3) * 0xad3e7;
  }
  pkVar6 = dic->table[(int)((uVar4 >> 0x10 ^ uVar4) % (uint)dic->length)];
  if (pkVar6 != (keynode *)0x0) {
    do {
      if (((uint)pkVar6->len == keyn) &&
         (iVar2 = bcmp(pkVar6->key,key,(ulong)(uint)keyn), iVar2 == 0)) {
        dic->value = &pkVar6->value;
        return 1;
      }
      pkVar6 = pkVar6->next;
    } while (pkVar6 != (keynode *)0x0);
  }
  return 0;
}

Assistant:

int dic_find(struct dictionary* dic, void *key, int keyn) {
	int n = hash_func((const char*)key, keyn) % dic->length;
	__builtin_prefetch(dic->table[n]);
	struct keynode *k = dic->table[n];
	if (!k) return 0;
	while (k) {
		if (k->len == keyn && !memcmp(k->key, key, keyn)) {
			dic->value = &k->value;
			return 1;
		}
		k = k->next;
	}
	return 0;
}